

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miditable.h
# Opt level: O0

TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_> __thiscall
rtosc::MidiMapperStorage::
TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_>::insert
          (TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_> *this,
          function<void_(short,_std::function<void_(const_char_*)>)> *t_)

{
  function<void_(short,_std::function<void_(const_char_*)>)> *in_RDI;
  TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_> TVar1;
  TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_> *unaff_retaddr;
  int i;
  TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_> next;
  int local_24;
  function<void_(short,_std::function<void_(const_char_*)>)> *__x;
  uint in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  undefined4 local_8;
  int in_stack_fffffffffffffffc;
  
  __x = in_RDI;
  TinyVector(unaff_retaddr,in_stack_fffffffffffffffc);
  for (local_24 = 0; local_24 < *(int *)&(in_RDI->super__Function_base)._M_functor;
      local_24 = local_24 + 1) {
    std::function<void_(short,_std::function<void_(const_char_*)>)>::operator=
              ((function<void_(short,_std::function<void_(const_char_*)>)> *)
               CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),__x);
  }
  std::function<void_(short,_std::function<void_(const_char_*)>)>::operator=
            ((function<void_(short,_std::function<void_(const_char_*)>)> *)
             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),__x);
  TVar1._4_4_ = 0;
  TVar1.n = in_stack_fffffffffffffff0;
  TVar1.t._4_4_ = in_stack_fffffffffffffffc;
  TVar1.t._0_4_ = local_8;
  return TVar1;
}

Assistant:

TinyVector insert(const T &t_)
            {TinyVector next(n+1); for(int i=0;i<n; ++i) next.t[i]=t[i]; next.t[n] = t_;return next;}